

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

cmStateSnapshot * __thiscall
cmState::CreateVariableScopeSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  iterator it;
  PositionType PVar3;
  PositionType PVar4;
  ReferenceType __src;
  PointerType pSVar5;
  PointerType pBVar6;
  PointerType pSVar7;
  iterator iVar8;
  PositionType pos;
  SnapshotDataType local_1d0;
  undefined1 local_100 [208];
  
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  memcpy(local_100,__src,0xd0);
  memcpy(&local_1d0,local_100,0xd0);
  local_1d0.ScopeParent =
       cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl(&this->SnapshotData,it,&local_1d0);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  PVar3 = (originSnapshot->Position).Position;
  (pSVar5->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar5->ScopeParent).Position = PVar3;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar5->SnapshotType = VariableScopeType;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar5->Keep = false;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar5->BuildSystemDirectory);
  (pBVar6->CurrentScope).Tree = local_1d0.ScopeParent.Tree;
  (pBVar6->CurrentScope).Position = local_1d0.ScopeParent.Position;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar7 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  PVar4 = (pSVar5->Policies).Position;
  (pSVar7->PolicyScope).Tree = (pSVar5->Policies).Tree;
  (pSVar7->PolicyScope).Position = PVar4;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar5->Vars).Tree;
  if ((pcVar1 == (cmLinkedTree<cmDefinitions> *)0x0) ||
     ((ulong)(((long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
      (pSVar5->Vars).Position)) {
    __assert_fail("originSnapshot.Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x3b1,
                  "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
  }
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar1 = (pSVar5->Vars).Tree;
  PVar2 = (pSVar5->Vars).Position;
  iVar8 = pSVar5->Vars;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  (pSVar5->Parent).Tree = pcVar1;
  (pSVar5->Parent).Position = PVar2;
  iVar8 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar8);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pSVar5->Vars = iVar8;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&local_1d0.ScopeParent);
  pcVar1 = (pSVar5->Vars).Tree;
  if ((pcVar1 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar5->Vars).Position <=
      (ulong)(((long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar1->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_1d0.ScopeParent);
    return __return_storage_ptr__;
  }
  __assert_fail("pos->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x3b6,
                "cmStateSnapshot cmState::CreateVariableScopeSnapshot(const cmStateSnapshot &)");
}

Assistant:

cmStateSnapshot cmState::CreateVariableScopeSnapshot(
  cmStateSnapshot const& originSnapshot)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::VariableScopeType;
  pos->Keep = false;
  pos->BuildSystemDirectory->CurrentScope = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());

  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  assert(pos->Vars.IsValid());
  return { this, pos };
}